

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::TestSpec::Pattern> * __thiscall
Catch::Ptr<Catch::TestSpec::Pattern>::operator=(Ptr<Catch::TestSpec::Pattern> *this,Pattern *p)

{
  Ptr<Catch::TestSpec::Pattern> local_20;
  
  if (p != (Pattern *)0x0) {
    (*(p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[2])(p)
    ;
  }
  local_20 = (Ptr<Catch::TestSpec::Pattern>)this->m_p;
  this->m_p = p;
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }